

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_process_priority_frame(nghttp2_session *session)

{
  int iVar1;
  nghttp2_frame *frame;
  nghttp2_inbound_frame *iframe;
  nghttp2_session *session_local;
  
  iVar1 = session_no_rfc7540_pri_no_fallback(session);
  if (iVar1 == 0) {
    nghttp2_frame_unpack_priority_payload
              ((nghttp2_priority *)&session->iframe,(session->iframe).sbuf.pos);
    iVar1 = nghttp2_session_on_priority_received(session,&(session->iframe).frame);
    return iVar1;
  }
  __assert_fail("!session_no_rfc7540_pri_no_fallback(session)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x11b0,"int session_process_priority_frame(nghttp2_session *)");
}

Assistant:

static int session_process_priority_frame(nghttp2_session *session) {
  nghttp2_inbound_frame *iframe = &session->iframe;
  nghttp2_frame *frame = &iframe->frame;

  assert(!session_no_rfc7540_pri_no_fallback(session));

  nghttp2_frame_unpack_priority_payload(&frame->priority, iframe->sbuf.pos);

  return nghttp2_session_on_priority_received(session, frame);
}